

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O2

void __thiscall LargeGapGrayCode::printStatistics(LargeGapGrayCode *this,int bitWidth)

{
  ostream *poVar1;
  long *plVar2;
  LargeGapGrayCode *this_00;
  undefined1 local_68 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> runLengths;
  int local_30;
  int local_2c;
  int minGap;
  int minCount;
  int maxGap;
  int maxCount;
  
  this_00 = (LargeGapGrayCode *)local_68;
  computeRunLengths((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                    local_68,this,bitWidth);
  computeMinGap(this_00,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_68,&local_30,&local_2c);
  computeMaxGap(this_00,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_68,&minGap,&minCount);
  runLengths._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)computeGapVariance(this_00,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                           *)local_68);
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 5;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bitWidth);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
  poVar1 = std::operator<<(poVar1,(string *)
                                  ((this->m_creationMethod).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (long)bitWidth + -1))
  ;
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_30);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,minGap);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
  plVar2 = (long *)std::ostream::operator<<(poVar1,minCount);
  *(undefined8 *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x10) = 0xe;
  poVar1 = std::ostream::_M_insert<double>
                     ((double)runLengths._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_68);
  return;
}

Assistant:

void LargeGapGrayCode::printStatistics(int bitWidth)
{
	std::map<int, int> runLengths = computeRunLengths(bitWidth);
	int minGap, minCount, maxGap, maxCount;
	computeMinGap(runLengths, minGap, minCount);
	computeMaxGap(runLengths, maxGap, maxCount);
	double gapVariance = computeGapVariance(runLengths);
	std::cout 	<< std::setw(5) << bitWidth
			<< std::setw(12) << m_creationMethod[bitWidth-1]
			<< std::setw(12) << minGap
			<< std::setw(12) << maxGap
			<< std::setw(12) << minCount
			<< std::setw(12) << maxCount
			<< std::setw(14) << gapVariance << std::endl;
}